

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O0

void __thiscall MessageThread::MessageThread(MessageThread *this,int q,MessageQueue *mq)

{
  shared_ptr<EventLoop> local_30;
  MessageQueue *local_20;
  MessageQueue *mq_local;
  MessageThread *pMStack_10;
  int q_local;
  MessageThread *this_local;
  
  local_20 = mq;
  mq_local._4_4_ = q;
  pMStack_10 = this;
  Thread::Thread(&this->super_Thread);
  std::enable_shared_from_this<MessageThread>::enable_shared_from_this
            (&this->super_enable_shared_from_this<MessageThread>);
  (this->super_Thread)._vptr_Thread = (_func_int **)&PTR__MessageThread_00302398;
  this->queueId = mq_local._4_4_;
  this->queue = local_20;
  std::mutex::mutex(&this->mutex);
  this->stopped = false;
  EventLoop::eventLoop();
  std::weak_ptr<EventLoop>::weak_ptr<EventLoop,void>(&this->loop,&local_30);
  std::shared_ptr<EventLoop>::~shared_ptr(&local_30);
  return;
}

Assistant:

MessageThread(int q, MessageQueue* mq)
        : queueId(q), queue(mq), stopped(false), loop(EventLoop::eventLoop())
    {
    }